

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

PixelValue vkt::anon_unknown_0::clearValueToPixelValue(VkClearValue *value,TextureFormat *format)

{
  bool *pbVar1;
  bool local_8d;
  int local_8c;
  int local_88;
  int i_2;
  int i_1;
  int i;
  BVec4 channelMask;
  TextureChannelClass channelClass;
  Maybe<bool> local_68 [2];
  Maybe<bool> local_48;
  Maybe<bool> local_38;
  bool local_23;
  byte local_22;
  byte local_21;
  bool isDepthOrStencilAttachment;
  bool isStencilAttachment;
  TextureFormat *pTStack_20;
  bool isDepthAttachment;
  TextureFormat *format_local;
  VkClearValue *value_local;
  PixelValue pixelValue;
  
  pTStack_20 = format;
  format_local = (TextureFormat *)value;
  local_21 = tcu::hasDepthComponent(format->order);
  local_22 = tcu::hasStencilComponent(pTStack_20->order);
  local_8d = true;
  if ((local_21 & 1) == 0) {
    local_8d = (bool)local_22;
  }
  local_23 = local_8d;
  tcu::nothing<bool>();
  tcu::nothing<bool>();
  tcu::nothing<bool>();
  tcu::nothing<bool>();
  PixelValue::PixelValue
            ((PixelValue *)((long)&value_local + 6),&local_38,&local_48,local_68,
             (Maybe<bool> *)&channelMask);
  tcu::Maybe<bool>::~Maybe((Maybe<bool> *)&channelMask);
  tcu::Maybe<bool>::~Maybe(local_68);
  tcu::Maybe<bool>::~Maybe(&local_48);
  tcu::Maybe<bool>::~Maybe(&local_38);
  if ((local_23 & 1U) == 0) {
    i = tcu::getTextureChannelClass(pTStack_20->type);
    tcu::getTextureFormatChannelMask((tcu *)&i_1,pTStack_20);
    switch(i) {
    case 0:
    case 1:
    case 4:
      for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
        pbVar1 = tcu::Vector<bool,_4>::operator[]((Vector<bool,_4> *)&i_1,local_8c);
        if ((*pbVar1 & 1U) != 0) {
          if (((float)(&format_local->order)[local_8c] != 1.0) ||
             (NAN((float)(&format_local->order)[local_8c]))) {
            if (((float)(&format_local->order)[local_8c] == 0.0) &&
               (!NAN((float)(&format_local->order)[local_8c]))) {
              PixelValue::setValue((PixelValue *)((long)&value_local + 6),(long)local_8c,false);
            }
          }
          else {
            PixelValue::setValue((PixelValue *)((long)&value_local + 6),(long)local_8c,true);
          }
        }
      }
      break;
    case 2:
      for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
        pbVar1 = tcu::Vector<bool,_4>::operator[]((Vector<bool,_4> *)&i_1,i_2);
        if ((*pbVar1 & 1U) != 0) {
          if ((&format_local->order)[i_2] == A) {
            PixelValue::setValue((PixelValue *)((long)&value_local + 6),(long)i_2,true);
          }
          else if ((&format_local->order)[i_2] == R) {
            PixelValue::setValue((PixelValue *)((long)&value_local + 6),(long)i_2,false);
          }
        }
      }
      break;
    case 3:
      for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
        pbVar1 = tcu::Vector<bool,_4>::operator[]((Vector<bool,_4> *)&i_1,local_88);
        if ((*pbVar1 & 1U) != 0) {
          if ((&format_local->order)[local_88] == A) {
            PixelValue::setValue((PixelValue *)((long)&value_local + 6),(long)local_88,true);
          }
          else if ((&format_local->order)[local_88] == R) {
            PixelValue::setValue((PixelValue *)((long)&value_local + 6),(long)local_88,false);
          }
        }
      }
    }
  }
  else {
    if ((local_21 & 1) != 0) {
      if (((float)format_local->order != 1.0) || (NAN((float)format_local->order))) {
        if (((float)format_local->order == 0.0) && (!NAN((float)format_local->order))) {
          PixelValue::setValue((PixelValue *)((long)&value_local + 6),0,false);
        }
      }
      else {
        PixelValue::setValue((PixelValue *)((long)&value_local + 6),0,true);
      }
    }
    if ((local_22 & 1) != 0) {
      if (format_local->type == 0xff) {
        PixelValue::setValue((PixelValue *)((long)&value_local + 6),1,true);
      }
      else if (format_local->type == SNORM_INT8) {
        PixelValue::setValue((PixelValue *)((long)&value_local + 6),1,false);
      }
    }
  }
  return (PixelValue)value_local._6_2_;
}

Assistant:

PixelValue clearValueToPixelValue (const VkClearValue&			value,
								   const tcu::TextureFormat&	format)
{
	const bool	isDepthAttachment			= hasDepthComponent(format.order);
	const bool	isStencilAttachment			= hasStencilComponent(format.order);
	const bool	isDepthOrStencilAttachment	= isDepthAttachment || isStencilAttachment;
	PixelValue	pixelValue;

	if (isDepthOrStencilAttachment)
	{
		if (isDepthAttachment)
		{
			if (value.depthStencil.depth == 1.0f)
				pixelValue.setValue(0, true);
			else if (value.depthStencil.depth == 0.0f)
				pixelValue.setValue(0, false);
			else
				DE_FATAL("Unknown depth value");
		}

		if (isStencilAttachment)
		{
			if (value.depthStencil.stencil == 0xFFu)
				pixelValue.setValue(1, true);
			else if (value.depthStencil.stencil == 0x0u)
				pixelValue.setValue(1, false);
			else
				DE_FATAL("Unknown stencil value");
		}
	}
	else
	{
		const tcu::TextureChannelClass	channelClass	= tcu::getTextureChannelClass(format.type);
		const tcu::BVec4				channelMask		= tcu::getTextureFormatChannelMask(format);

		switch (channelClass)
		{
			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
				for (int i = 0; i < 4; i++)
				{
					if (channelMask[i])
					{
						if (value.color.int32[i] == 1)
							pixelValue.setValue(i, true);
						else if (value.color.int32[i] == 0)
							pixelValue.setValue(i, false);
						else
							DE_FATAL("Unknown clear color value");
					}
				}
				break;

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
				for (int i = 0; i < 4; i++)
				{
					if (channelMask[i])
					{
						if (value.color.uint32[i] == 1u)
							pixelValue.setValue(i, true);
						else if (value.color.uint32[i] == 0u)
							pixelValue.setValue(i, false);
						else
							DE_FATAL("Unknown clear color value");
					}
				}
				break;

			case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
				for (int i = 0; i < 4; i++)
				{
					if (channelMask[i])
					{
						if (value.color.float32[i] == 1.0f)
							pixelValue.setValue(i, true);
						else if (value.color.float32[i] == 0.0f)
							pixelValue.setValue(i, false);
						else
							DE_FATAL("Unknown clear color value");
					}
				}
				break;

			default:
				DE_FATAL("Unknown channel class");
		}
	}

	return pixelValue;
}